

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O2

void __thiscall
EnvironmentROBARM::ContXY2Cell
          (EnvironmentROBARM *this,double x,double y,unsigned_short *pX,unsigned_short *pY)

{
  double dVar1;
  int iVar2;
  ushort uVar3;
  
  dVar1 = (this->EnvROBARMCfg).GridCellWidth;
  uVar3 = (ushort)(int)(x / dVar1);
  if (x < 0.0) {
    uVar3 = 0;
  }
  *pX = uVar3;
  iVar2 = (this->EnvROBARMCfg).EnvWidth_c;
  if (iVar2 <= (int)(uint)uVar3) {
    *pX = (short)iVar2 - 1;
  }
  uVar3 = (ushort)(int)(y / dVar1);
  if (y < 0.0) {
    uVar3 = 0;
  }
  *pY = uVar3;
  iVar2 = (this->EnvROBARMCfg).EnvHeight_c;
  if (iVar2 <= (int)(uint)uVar3) {
    *pY = (short)iVar2 - 1;
  }
  return;
}

Assistant:

void EnvironmentROBARM::ContXY2Cell(double x, double y, short unsigned int* pX, short unsigned int *pY)
{
    //take the nearest cell
    *pX = (int)(x / EnvROBARMCfg.GridCellWidth);
    if (x < 0) *pX = 0;
    if (*pX >= EnvROBARMCfg.EnvWidth_c) *pX = EnvROBARMCfg.EnvWidth_c - 1;

    *pY = (int)(y / EnvROBARMCfg.GridCellWidth);
    if (y < 0) *pY = 0;
    if (*pY >= EnvROBARMCfg.EnvHeight_c) *pY = EnvROBARMCfg.EnvHeight_c - 1;
}